

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

int emit_indname_block(nghttp2_bufs *bufs,size_t idx,nghttp2_nv *nv,int indexing_mode)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  size_t len;
  ulong uVar10;
  ulong uVar11;
  uint8_t sb [16];
  byte local_48;
  byte local_47 [23];
  
  uVar9 = idx + 1;
  uVar6 = 0xfffffff0;
  if (indexing_mode == 0) {
    uVar6 = 0xffffffc0;
  }
  uVar8 = ~uVar6;
  uVar7 = uVar9 - uVar8;
  bVar5 = (byte)uVar6;
  if (uVar9 < uVar8) {
    bVar2 = pack_first_byte(indexing_mode);
    local_48 = (byte)uVar9 | bVar5 & bVar2;
    len = 1;
  }
  else {
    if (uVar7 < 0x80) {
      bVar2 = pack_first_byte(indexing_mode);
      local_48 = (byte)uVar8 | bVar5 & bVar2;
      pbVar4 = local_47;
      len = 2;
    }
    else {
      uVar9 = uVar7;
      uVar11 = 0;
      do {
        uVar10 = uVar11;
        uVar11 = uVar10 + 1;
        bVar1 = 0x3fff < uVar9;
        uVar9 = uVar9 >> 7;
      } while (bVar1);
      if (0xe < uVar11) {
        return -0x20b;
      }
      len = uVar10 + 3;
      bVar2 = pack_first_byte(indexing_mode);
      local_48 = (byte)uVar8 | bVar5 & bVar2;
      pbVar4 = local_47;
      uVar9 = uVar7;
      if (0x7f < uVar7) {
        do {
          *pbVar4 = (byte)uVar9 | 0x80;
          uVar7 = uVar9 >> 7;
          pbVar4 = pbVar4 + 1;
          bVar1 = 0x3fff < uVar9;
          uVar9 = uVar7;
        } while (bVar1);
      }
    }
    *pbVar4 = (byte)uVar7;
  }
  iVar3 = nghttp2_bufs_add(bufs,&local_48,len);
  if (iVar3 == 0) {
    iVar3 = emit_string(bufs,nv->value,nv->valuelen);
  }
  return iVar3;
}

Assistant:

static int emit_indname_block(nghttp2_bufs *bufs, size_t idx,
                              const nghttp2_nv *nv, int indexing_mode) {
  int rv;
  uint8_t *bufp;
  size_t blocklen;
  uint8_t sb[16];
  size_t prefixlen;

  if (indexing_mode == NGHTTP2_HD_WITH_INDEXING) {
    prefixlen = 6;
  } else {
    prefixlen = 4;
  }

  DEBUGF("deflatehd: emit indname index=%zu, valuelen=%zu, indexing_mode=%d\n",
         idx, nv->valuelen, indexing_mode);

  blocklen = count_encoded_length(idx + 1, prefixlen);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;

  *bufp = pack_first_byte(indexing_mode);

  encode_length(bufp, idx + 1, prefixlen);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  rv = emit_string(bufs, nv->value, nv->valuelen);
  if (rv != 0) {
    return rv;
  }

  return 0;
}